

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O0

Matrix * __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::computeLocalObservationMatrix
          (ModelBaseEKFFlexEstimatorIMU *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Matrix *other;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  ExtendedKalmanFilter *this_00;
  Type local_d0;
  Matrix<double,__1,__1,_0,__1,__1> local_88;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_70;
  Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> local_60 [56];
  Matrix local_28;
  ModelBaseEKFFlexEstimatorIMU *local_10;
  ModelBaseEKFFlexEstimatorIMU *this_local;
  
  local_10 = this;
  iVar1 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  iVar2 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x13])();
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->op_,
             CONCAT44(extraout_var,iVar1) * 2,CONCAT44(extraout_var_00,iVar2));
  other = &(this->op_).CA;
  iVar1 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  iVar2 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x13])();
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&other->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             CONCAT44(extraout_var_01,iVar1),CONCAT44(extraout_var_02,iVar2));
  this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  KalmanFilterBase::getC(&local_28,&this_00->super_KalmanFilterBase);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(other,&local_28);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_28);
  iVar1 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  iVar2 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x13])();
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,long>
            ((Type *)local_60,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->op_,0,0,
             CONCAT44(extraout_var_03,iVar1),CONCAT44(extraout_var_04,iVar2));
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            (local_60,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)other);
  KalmanFilterBase::getA((Matrix *)&local_88,&this_00->super_KalmanFilterBase);
  local_70 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)other,
                        (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_88);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)&(this->op_).CA,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_70);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_88);
  iVar1 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  iVar2 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  iVar3 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x13])();
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,long>
            (&local_d0,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->op_,
             CONCAT44(extraout_var_05,iVar1),0,CONCAT44(extraout_var_06,iVar2),
             CONCAT44(extraout_var_07,iVar3));
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_d0,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->op_).CA);
  return &(this->op_).O;
}

Assistant:

stateObservation::Matrix & ModelBaseEKFFlexEstimatorIMU::computeLocalObservationMatrix()
{
  op_.O.resize(getMeasurementSize() * 2, getStateSize());
  op_.CA.resize(getMeasurementSize(), getStateSize());
  op_.CA = ekf_.getC();
  op_.O.block(0, 0, getMeasurementSize(), getStateSize()) = op_.CA;
  op_.CA = op_.CA * ekf_.getA();
  op_.O.block(getMeasurementSize(), 0, getMeasurementSize(), getStateSize()) = op_.CA;
  return op_.O;
}